

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O1

GENERAL_NAMES *
v2i_GENERAL_NAMES(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  bool bVar1;
  int iVar2;
  OPENSSL_STACK *sk;
  size_t sVar3;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  X509V3_EXT_METHOD *pXVar4;
  X509V3_EXT_METHOD *i;
  
  sk = OPENSSL_sk_new_null();
  if (sk != (OPENSSL_STACK *)0x0) {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar3 == 0) {
      return (GENERAL_NAMES *)sk;
    }
    i = (X509V3_EXT_METHOD *)0x0;
    do {
      pXVar4 = i;
      cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,(size_t)i);
      a = v2i_GENERAL_NAME_ex((GENERAL_NAME *)0x0,pXVar4,ctx,cnf,0);
      if ((a == (GENERAL_NAME *)0x0) || (sVar3 = OPENSSL_sk_push(sk,a), sVar3 == 0)) {
        GENERAL_NAME_free(a);
        iVar2 = 5;
        bVar1 = false;
      }
      else {
        iVar2 = 0;
        bVar1 = true;
      }
      if (!bVar1) goto LAB_0032d8ac;
      i = (X509V3_EXT_METHOD *)((long)&i->ext_nid + 1);
      pXVar4 = (X509V3_EXT_METHOD *)OPENSSL_sk_num((OPENSSL_STACK *)nval);
    } while (i < pXVar4);
    iVar2 = 2;
LAB_0032d8ac:
    if (iVar2 != 5) {
      return (GENERAL_NAMES *)sk;
    }
    OPENSSL_sk_pop_free_ex(sk,sk_GENERAL_NAME_call_free_func,GENERAL_NAME_free);
  }
  return (GENERAL_NAMES *)0x0;
}

Assistant:

GENERAL_NAMES *v2i_GENERAL_NAMES(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
    if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
      GENERAL_NAME_free(gen);
      goto err;
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}